

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall
lest::make_enum_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
          (lest *this,unexpected_type<std::__exception_ptr::exception_ptr> *item)

{
  lest local_d0 [55];
  allocator local_99;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  unexpected_type<std::__exception_ptr::exception_ptr> *local_18;
  unexpected_type<std::__exception_ptr::exception_ptr> *item_local;
  
  local_18 = item;
  item_local = (unexpected_type<std::__exception_ptr::exception_ptr> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"[type: ",&local_99);
  std::type_info::name
            ((type_info *)
             &nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>::typeinfo)
  ;
  std::operator+(local_78,(char *)local_98);
  std::operator+(local_58,(char *)local_78);
  make_memory_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
            (local_d0,local_18);
  std::operator+(local_38,local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return this;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}